

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter.cpp
# Opt level: O3

void __thiscall
Assimp::X3DImporter::MeshGeometry_AddColor
          (X3DImporter *this,aiMesh *pMesh,vector<int,_std::allocator<int>_> *pCoordIdx,
          vector<int,_std::allocator<int>_> *pColorIdx,
          list<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *pColors,bool pColorPerVertex)

{
  pointer *ppaVar1;
  undefined8 *puVar2;
  uint uVar3;
  uint uVar4;
  pointer piVar5;
  pointer piVar6;
  _List_node_base *p_Var7;
  pointer paVar8;
  undefined8 uVar9;
  _Base_ptr p_Var10;
  aiColor4t<float> *__args;
  float fVar11;
  vector<int,_std::allocator<int>_> *pvVar12;
  uint *puVar13;
  long lVar14;
  X3DImporter *this_00;
  runtime_error *prVar15;
  long *plVar16;
  uint *puVar17;
  ulong uVar18;
  size_type *psVar19;
  long *plVar20;
  uint *puVar21;
  ulong uVar22;
  _List_node_base *p_Var23;
  undefined1 auVar24 [8];
  vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> col_tgt_arr;
  vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> col_arr_copy;
  list<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> col_tgt_list;
  long *local_148;
  long local_140;
  long local_138;
  long lStack_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  undefined1 local_108 [8];
  _func_int **pp_Stack_100;
  undefined1 local_f8 [16];
  vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> local_e8;
  string local_d0;
  vector<int,_std::allocator<int>_> *local_b0;
  string local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  _List_node_base local_48;
  long local_38;
  
  local_108 = (undefined1  [8])0x0;
  pp_Stack_100 = (_func_int **)0x0;
  local_f8._0_8_ = 0;
  local_48._M_next = &local_48;
  local_38 = 0;
  local_e8.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (aiColor4t<float> *)0x0;
  local_e8.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_e8.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48._M_prev = local_48._M_next;
  if ((pCoordIdx->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish ==
      (pCoordIdx->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_start) {
    prVar15 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_148 = &local_138;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_148,"MeshGeometry_AddColor2. pCoordIdx can not be empty.","");
    std::runtime_error::runtime_error(prVar15,(string *)&local_148);
    *(undefined ***)prVar15 = &PTR__runtime_error_007fc4b8;
    __cxa_throw(prVar15,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::reserve
            (&local_e8,
             (pColors->super__List_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>).
             _M_impl._M_node._M_size);
  p_Var23 = (pColors->super__List_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>).
            _M_impl._M_node.super__List_node_base._M_next;
  local_b0 = pCoordIdx;
  if (p_Var23 != (_List_node_base *)pColors) {
    do {
      __args = (aiColor4t<float> *)(p_Var23 + 1);
      if (local_e8.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_e8.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<aiColor4t<float>,std::allocator<aiColor4t<float>>>::
        _M_realloc_insert<aiColor4t<float>const&>
                  ((vector<aiColor4t<float>,std::allocator<aiColor4t<float>>> *)&local_e8,
                   (iterator)
                   local_e8.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish,__args);
      }
      else {
        fVar11 = __args->g;
        p_Var7 = p_Var23[1]._M_prev;
        (local_e8.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
         super__Vector_impl_data._M_finish)->r = __args->r;
        (local_e8.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
         super__Vector_impl_data._M_finish)->g = fVar11;
        *(_List_node_base **)
         &(local_e8.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl
           .super__Vector_impl_data._M_finish)->b = p_Var7;
        local_e8.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_e8.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
             _M_impl.super__Vector_impl_data._M_finish + 1;
      }
      p_Var23 = (((_List_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *)
                 &p_Var23->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    } while (p_Var23 != (_List_node_base *)pColors);
  }
  pvVar12 = local_b0;
  piVar5 = (pColorIdx->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  piVar6 = (pColorIdx->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pColorPerVertex) {
    if (piVar6 == piVar5) {
      if ((pColors->super__List_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>)._M_impl.
          _M_node._M_size < (ulong)pMesh->mNumVertices) {
        prVar15 = (runtime_error *)__cxa_allocate_exception(0x10);
        to_string<unsigned_long>
                  (&local_d0,
                   (pColors->super__List_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>)
                   ._M_impl._M_node._M_size);
        std::operator+(&local_88,"MeshGeometry_AddColor2. Colors count(",&local_d0);
        plVar16 = (long *)std::__cxx11::string::append((char *)&local_88);
        local_128._M_dataplus._M_p = (pointer)*plVar16;
        psVar19 = (size_type *)(plVar16 + 2);
        if ((size_type *)local_128._M_dataplus._M_p == psVar19) {
          local_128.field_2._M_allocated_capacity = *psVar19;
          local_128.field_2._8_8_ = plVar16[3];
          local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
        }
        else {
          local_128.field_2._M_allocated_capacity = *psVar19;
        }
        local_128._M_string_length = plVar16[1];
        *plVar16 = (long)psVar19;
        plVar16[1] = 0;
        *(undefined1 *)(plVar16 + 2) = 0;
        to_string<unsigned_int>(&local_a8,pMesh->mNumVertices);
        std::operator+(&local_68,&local_128,&local_a8);
        plVar16 = (long *)std::__cxx11::string::append((char *)&local_68);
        local_148 = (long *)*plVar16;
        plVar20 = plVar16 + 2;
        if (local_148 == plVar20) {
          local_138 = *plVar20;
          lStack_130 = plVar16[3];
          local_148 = &local_138;
        }
        else {
          local_138 = *plVar20;
        }
        local_140 = plVar16[1];
        *plVar16 = (long)plVar20;
        plVar16[1] = 0;
        *(undefined1 *)(plVar16 + 2) = 0;
        std::runtime_error::runtime_error(prVar15,(string *)&local_148);
        *(undefined ***)prVar15 = &PTR__runtime_error_007fc4b8;
        __cxa_throw(prVar15,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
      }
      this_00 = (X3DImporter *)local_108;
      std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::resize
                ((vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *)this_00,
                 (ulong)pMesh->mNumVertices);
      if (pMesh->mNumVertices != 0) {
        lVar14 = 0;
        uVar18 = 0;
        do {
          puVar2 = (undefined8 *)
                   ((long)&(((_Vector_impl *)
                            &((BaseImporter *)
                             &(local_e8.
                               super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->r)->_vptr_BaseImporter)->
                           super__Vector_impl_data)._M_start + lVar14);
          uVar9 = puVar2[1];
          *(undefined8 *)((long)local_108 + lVar14) = *puVar2;
          ((undefined8 *)((long)local_108 + lVar14))[1] = uVar9;
          uVar18 = uVar18 + 1;
          lVar14 = lVar14 + 0x10;
        } while (uVar18 < pMesh->mNumVertices);
      }
    }
    else {
      if ((ulong)((long)piVar6 - (long)piVar5) <
          (ulong)((long)(local_b0->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)(local_b0->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_start)) {
        prVar15 = (runtime_error *)__cxa_allocate_exception(0x10);
        to_string<unsigned_long>
                  (&local_d0,
                   (long)(pColorIdx->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)(pColorIdx->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_start >> 2);
        std::operator+(&local_88,"MeshGeometry_AddColor2. Colors indices count(",&local_d0);
        plVar16 = (long *)std::__cxx11::string::append((char *)&local_88);
        local_128._M_dataplus._M_p = (pointer)*plVar16;
        psVar19 = (size_type *)(plVar16 + 2);
        if ((size_type *)local_128._M_dataplus._M_p == psVar19) {
          local_128.field_2._M_allocated_capacity = *psVar19;
          local_128.field_2._8_8_ = plVar16[3];
          local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
        }
        else {
          local_128.field_2._M_allocated_capacity = *psVar19;
        }
        local_128._M_string_length = plVar16[1];
        *plVar16 = (long)psVar19;
        plVar16[1] = 0;
        *(undefined1 *)(plVar16 + 2) = 0;
        to_string<unsigned_long>
                  (&local_a8,
                   (long)(local_b0->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)(local_b0->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_start >> 2);
        std::operator+(&local_68,&local_128,&local_a8);
        plVar16 = (long *)std::__cxx11::string::append((char *)&local_68);
        local_148 = (long *)*plVar16;
        plVar20 = plVar16 + 2;
        if (local_148 == plVar20) {
          local_138 = *plVar20;
          lStack_130 = plVar16[3];
          local_148 = &local_138;
        }
        else {
          local_138 = *plVar20;
        }
        local_140 = plVar16[1];
        *plVar16 = (long)plVar20;
        plVar16[1] = 0;
        *(undefined1 *)(plVar16 + 2) = 0;
        std::runtime_error::runtime_error(prVar15,(string *)&local_148);
        *(undefined ***)prVar15 = &PTR__runtime_error_007fc4b8;
        __cxa_throw(prVar15,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
      }
      this_00 = (X3DImporter *)local_108;
      std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::resize
                ((vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *)this_00,
                 (ulong)pMesh->mNumVertices);
      puVar13 = (uint *)(pColorIdx->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_start;
      puVar21 = (uint *)(pColorIdx->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_finish;
      if (puVar13 != puVar21) {
        puVar17 = (uint *)(pvVar12->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                          super__Vector_impl_data._M_start;
        do {
          uVar3 = *puVar13;
          if ((long)(int)uVar3 != -1) {
            uVar4 = *puVar17;
            if (pMesh->mNumVertices < uVar4) {
              prVar15 = (runtime_error *)__cxa_allocate_exception(0x10);
              local_148 = &local_138;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_148,
                         "MeshGeometry_AddColor2. Coordinate idx is out of range.","");
              std::runtime_error::runtime_error(prVar15,(string *)&local_148);
              *(undefined ***)prVar15 = &PTR__runtime_error_007fc4b8;
              __cxa_throw(prVar15,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
            }
            if (pMesh->mNumVertices < uVar3) {
              prVar15 = (runtime_error *)__cxa_allocate_exception(0x10);
              local_148 = &local_138;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_148,"MeshGeometry_AddColor2. Color idx is out of range.",
                         "");
              std::runtime_error::runtime_error(prVar15,(string *)&local_148);
              *(undefined ***)prVar15 = &PTR__runtime_error_007fc4b8;
              __cxa_throw(prVar15,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
            }
            ppaVar1 = &(((_Vector_impl *)
                        &((BaseImporter *)
                         &(local_e8.
                           super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
                           _M_impl.super__Vector_impl_data._M_start)->r)->_vptr_BaseImporter)->
                       super__Vector_impl_data)._M_start + (long)(int)uVar3 * 2;
            paVar8 = ppaVar1[1];
            *(_func_int **)((long)local_108 + (long)(int)uVar4 * 2 * 8) = (_func_int *)*ppaVar1;
            ((_func_int **)((long)local_108 + (long)(int)uVar4 * 2 * 8))[1] = (_func_int *)paVar8;
            puVar21 = (uint *)(pColorIdx->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                              super__Vector_impl_data._M_finish;
            this_00 = (X3DImporter *)
                      local_e8.
                      super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
                      _M_impl.super__Vector_impl_data._M_start;
          }
          puVar13 = puVar13 + 1;
          puVar17 = puVar17 + 1;
        } while (puVar13 != puVar21);
      }
    }
  }
  else if ((long)piVar6 - (long)piVar5 == 0) {
    if ((pColors->super__List_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>)._M_impl.
        _M_node._M_size < (ulong)pMesh->mNumFaces) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x10);
      to_string<unsigned_long>
                (&local_d0,
                 (pColors->super__List_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>).
                 _M_impl._M_node._M_size);
      std::operator+(&local_88,"MeshGeometry_AddColor2. Colors count(",&local_d0);
      plVar16 = (long *)std::__cxx11::string::append((char *)&local_88);
      local_128._M_dataplus._M_p = (pointer)*plVar16;
      psVar19 = (size_type *)(plVar16 + 2);
      if ((size_type *)local_128._M_dataplus._M_p == psVar19) {
        local_128.field_2._M_allocated_capacity = *psVar19;
        local_128.field_2._8_8_ = plVar16[3];
        local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
      }
      else {
        local_128.field_2._M_allocated_capacity = *psVar19;
      }
      local_128._M_string_length = plVar16[1];
      *plVar16 = (long)psVar19;
      plVar16[1] = 0;
      *(undefined1 *)(plVar16 + 2) = 0;
      to_string<unsigned_int>(&local_a8,pMesh->mNumFaces);
      std::operator+(&local_68,&local_128,&local_a8);
      plVar16 = (long *)std::__cxx11::string::append((char *)&local_68);
      local_148 = (long *)*plVar16;
      plVar20 = plVar16 + 2;
      if (local_148 == plVar20) {
        local_138 = *plVar20;
        lStack_130 = plVar16[3];
        local_148 = &local_138;
      }
      else {
        local_138 = *plVar20;
      }
      local_140 = plVar16[1];
      *plVar16 = (long)plVar20;
      plVar16[1] = 0;
      *(undefined1 *)(plVar16 + 2) = 0;
      std::runtime_error::runtime_error(prVar15,(string *)&local_148);
      *(undefined ***)prVar15 = &PTR__runtime_error_007fc4b8;
      __cxa_throw(prVar15,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    this_00 = (X3DImporter *)local_108;
    std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::resize
              ((vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *)this_00,
               (ulong)pMesh->mNumFaces);
    if (pMesh->mNumFaces != 0) {
      lVar14 = 0;
      uVar18 = 0;
      do {
        puVar2 = (undefined8 *)
                 ((long)&(((_Vector_impl *)
                          &((BaseImporter *)
                           &(local_e8.
                             super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->r)->_vptr_BaseImporter)->
                         super__Vector_impl_data)._M_start + lVar14);
        uVar9 = puVar2[1];
        *(undefined8 *)((long)local_108 + lVar14) = *puVar2;
        ((undefined8 *)((long)local_108 + lVar14))[1] = uVar9;
        uVar18 = uVar18 + 1;
        lVar14 = lVar14 + 0x10;
      } while (uVar18 < pMesh->mNumFaces);
    }
  }
  else {
    if ((ulong)((long)piVar6 - (long)piVar5 >> 2) < (ulong)pMesh->mNumFaces) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x10);
      to_string<unsigned_long>
                (&local_d0,
                 (long)(pColorIdx->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)(pColorIdx->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_start >> 2);
      std::operator+(&local_88,"MeshGeometry_AddColor2. Colors indices count(",&local_d0);
      plVar16 = (long *)std::__cxx11::string::append((char *)&local_88);
      local_128._M_dataplus._M_p = (pointer)*plVar16;
      psVar19 = (size_type *)(plVar16 + 2);
      if ((size_type *)local_128._M_dataplus._M_p == psVar19) {
        local_128.field_2._M_allocated_capacity = *psVar19;
        local_128.field_2._8_8_ = plVar16[3];
        local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
      }
      else {
        local_128.field_2._M_allocated_capacity = *psVar19;
      }
      local_128._M_string_length = plVar16[1];
      *plVar16 = (long)psVar19;
      plVar16[1] = 0;
      *(undefined1 *)(plVar16 + 2) = 0;
      to_string<unsigned_int>(&local_a8,pMesh->mNumFaces);
      std::operator+(&local_68,&local_128,&local_a8);
      plVar16 = (long *)std::__cxx11::string::append((char *)&local_68);
      local_148 = (long *)*plVar16;
      plVar20 = plVar16 + 2;
      if (local_148 == plVar20) {
        local_138 = *plVar20;
        lStack_130 = plVar16[3];
        local_148 = &local_138;
      }
      else {
        local_138 = *plVar20;
      }
      local_140 = plVar16[1];
      *plVar16 = (long)plVar20;
      plVar16[1] = 0;
      *(undefined1 *)(plVar16 + 2) = 0;
      std::runtime_error::runtime_error(prVar15,(string *)&local_148);
      *(undefined ***)prVar15 = &PTR__runtime_error_007fc4b8;
      __cxa_throw(prVar15,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    this_00 = (X3DImporter *)local_108;
    std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::resize
              ((vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *)this_00,
               (ulong)pMesh->mNumFaces);
    uVar18 = (ulong)pMesh->mNumFaces;
    if (pMesh->mNumFaces != 0) {
      piVar5 = (pColorIdx->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      lVar14 = 0;
      uVar22 = 0;
      do {
        uVar3 = piVar5[uVar22];
        if ((uint)uVar18 < uVar3) {
          prVar15 = (runtime_error *)__cxa_allocate_exception(0x10);
          local_148 = &local_138;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_148,"MeshGeometry_AddColor2. Face idx is out of range.","");
          std::runtime_error::runtime_error(prVar15,(string *)&local_148);
          *(undefined ***)prVar15 = &PTR__runtime_error_007fc4b8;
          __cxa_throw(prVar15,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
        }
        this_00 = (X3DImporter *)((long)(int)uVar3 * 0x10);
        puVar2 = (undefined8 *)
                 ((long)&(((_Vector_impl *)
                          &((BaseImporter *)
                           &(local_e8.
                             super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->r)->_vptr_BaseImporter)->
                         super__Vector_impl_data)._M_start +
                 (long)&(((_Vector_impl *)&(this_00->super_BaseImporter)._vptr_BaseImporter)->
                        super__Vector_impl_data)._M_start);
        uVar9 = puVar2[1];
        *(undefined8 *)((long)local_108 + lVar14) = *puVar2;
        ((undefined8 *)((long)local_108 + lVar14))[1] = uVar9;
        uVar22 = uVar22 + 1;
        uVar18 = (ulong)pMesh->mNumFaces;
        lVar14 = lVar14 + 0x10;
      } while (uVar22 < uVar18);
    }
  }
  auVar24 = local_108;
  if (local_108 != (undefined1  [8])pp_Stack_100) {
    do {
      this_00 = (X3DImporter *)operator_new(0x20);
      p_Var10 = *(_Base_ptr *)((long)auVar24 + 8);
      *(_func_int **)
       &(this_00->super_BaseImporter).importerUnits._M_t._M_impl.super__Rb_tree_header._M_header =
           *(_func_int **)auVar24;
      (this_00->super_BaseImporter).importerUnits._M_t._M_impl.super__Rb_tree_header._M_header.
      _M_parent = p_Var10;
      std::__detail::_List_node_base::_M_hook((_List_node_base *)this_00);
      local_38 = local_38 + 1;
      auVar24 = (undefined1  [8])((long)auVar24 + 0x10);
    } while (auVar24 != (undefined1  [8])pp_Stack_100);
  }
  MeshGeometry_AddColor
            (this_00,pMesh,(list<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *)&local_48,
             pColorPerVertex);
  p_Var23 = local_48._M_next;
  if ((X3DImporter *)
      local_e8.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
      super__Vector_impl_data._M_start != (X3DImporter *)0x0) {
    operator_delete(local_e8.
                    super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl
                    .super__Vector_impl_data._M_start);
    p_Var23 = local_48._M_next;
  }
  while (p_Var23 != &local_48) {
    p_Var7 = (((_List_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *)&p_Var23->_M_next
              )->_M_impl)._M_node.super__List_node_base._M_next;
    operator_delete(p_Var23);
    p_Var23 = p_Var7;
  }
  if (local_108 != (undefined1  [8])0x0) {
    operator_delete((void *)local_108);
  }
  return;
}

Assistant:

void X3DImporter::MeshGeometry_AddColor(aiMesh& pMesh, const std::vector<int32_t>& pCoordIdx, const std::vector<int32_t>& pColorIdx,
										const std::list<aiColor4D>& pColors, const bool pColorPerVertex) const
{
    std::vector<aiColor4D> col_tgt_arr;
    std::list<aiColor4D> col_tgt_list;
    std::vector<aiColor4D> col_arr_copy;

    if ( pCoordIdx.size() == 0 )
    {
        throw DeadlyImportError( "MeshGeometry_AddColor2. pCoordIdx can not be empty." );
    }

	// copy list to array because we are need indexed access to colors.
	col_arr_copy.reserve(pColors.size());
    for ( std::list<aiColor4D>::const_iterator it = pColors.begin(); it != pColors.end(); ++it )
    {
        col_arr_copy.push_back( *it );
    }

	if(pColorPerVertex)
	{
		if(pColorIdx.size() > 0)
		{
			// check indices array count.
			if(pColorIdx.size() < pCoordIdx.size())
			{
				throw DeadlyImportError("MeshGeometry_AddColor2. Colors indices count(" + to_string(pColorIdx.size()) +
										") can not be less than Coords inidces count(" + to_string(pCoordIdx.size()) +  ").");
			}
			// create list with colors for every vertex.
			col_tgt_arr.resize(pMesh.mNumVertices);
			for(std::vector<int32_t>::const_iterator colidx_it = pColorIdx.begin(), coordidx_it = pCoordIdx.begin(); colidx_it != pColorIdx.end(); ++colidx_it, ++coordidx_it)
			{
                if ( *colidx_it == ( -1 ) )
                {
                    continue;// skip faces delimiter
                }
                if ( ( unsigned int ) ( *coordidx_it ) > pMesh.mNumVertices )
                {
                    throw DeadlyImportError( "MeshGeometry_AddColor2. Coordinate idx is out of range." );
                }
                if ( ( unsigned int ) *colidx_it > pMesh.mNumVertices )
                {
                    throw DeadlyImportError( "MeshGeometry_AddColor2. Color idx is out of range." );
                }

				col_tgt_arr[*coordidx_it] = col_arr_copy[*colidx_it];
			}
		}// if(pColorIdx.size() > 0)
		else
		{
			// when color indices list is absent use CoordIdx.
			// check indices array count.
			if(pColors.size() < pMesh.mNumVertices)
			{
				throw DeadlyImportError("MeshGeometry_AddColor2. Colors count(" + to_string(pColors.size()) + ") can not be less than Vertices count(" +
										to_string(pMesh.mNumVertices) +  ").");
			}
			// create list with colors for every vertex.
			col_tgt_arr.resize(pMesh.mNumVertices);
            for ( size_t i = 0; i < pMesh.mNumVertices; i++ )
            {
                col_tgt_arr[ i ] = col_arr_copy[ i ];
            }
		}// if(pColorIdx.size() > 0) else
	}// if(pColorPerVertex)
	else
	{
		if(pColorIdx.size() > 0)
		{
			// check indices array count.
			if(pColorIdx.size() < pMesh.mNumFaces)
			{
				throw DeadlyImportError("MeshGeometry_AddColor2. Colors indices count(" + to_string(pColorIdx.size()) +
										") can not be less than Faces count(" + to_string(pMesh.mNumFaces) +  ").");
			}
			// create list with colors for every vertex using faces indices.
			col_tgt_arr.resize(pMesh.mNumFaces);

			std::vector<int32_t>::const_iterator colidx_it = pColorIdx.begin();
			for(size_t fi = 0; fi < pMesh.mNumFaces; fi++)
			{
				if((unsigned int)*colidx_it > pMesh.mNumFaces) throw DeadlyImportError("MeshGeometry_AddColor2. Face idx is out of range.");

				col_tgt_arr[fi] = col_arr_copy[*colidx_it++];
			}
		}// if(pColorIdx.size() > 0)
		else
		{
			// when color indices list is absent use CoordIdx.
			// check indices array count.
			if(pColors.size() < pMesh.mNumFaces)
			{
				throw DeadlyImportError("MeshGeometry_AddColor2. Colors count(" + to_string(pColors.size()) + ") can not be less than Faces count(" +
										to_string(pMesh.mNumFaces) +  ").");
			}
			// create list with colors for every vertex using faces indices.
			col_tgt_arr.resize(pMesh.mNumFaces);
			for(size_t fi = 0; fi < pMesh.mNumFaces; fi++) col_tgt_arr[fi] = col_arr_copy[fi];

		}// if(pColorIdx.size() > 0) else
	}// if(pColorPerVertex) else

	// copy array to list for calling function that add colors.
	for(std::vector<aiColor4D>::const_iterator it = col_tgt_arr.begin(); it != col_tgt_arr.end(); ++it) col_tgt_list.push_back(*it);
	// add prepared colors list to mesh.
	MeshGeometry_AddColor(pMesh, col_tgt_list, pColorPerVertex);
}